

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O2

void __thiscall QScrollBarPrivate::flash(QScrollBarPrivate *this)

{
  undefined8 uVar1;
  long lVar2;
  QWidget *this_00;
  int iVar3;
  QStyle *pQVar4;
  long lVar5;
  undefined8 *puVar6;
  QStyleOptionSlider *pQVar7;
  long in_FS_OFFSET;
  QStyleOptionSlider opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar6 = &DAT_00661ce0;
  pQVar7 = &opt;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar1 = *puVar6;
    (pQVar7->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar7->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar6 = puVar6 + 1;
    pQVar7 = (QStyleOptionSlider *)&(pQVar7->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00);
  if (this->flashed == false) {
    pQVar4 = QWidget::style(this_00);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x60,&opt,this_00,0);
    if (iVar3 != 0) {
      this->flashed = true;
      if ((this_00->data->widget_attributes & 0x8000) == 0) {
        QWidget::show(this_00);
      }
      else {
        QWidget::update(this_00);
      }
    }
  }
  if ((this->flashTimer).m_id == Invalid) {
    QBasicTimer::start(&this->flashTimer,(Duration)0x0,&this_00->super_QObject);
  }
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollBarPrivate::flash()
{
    Q_Q(QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    if (!flashed && q->style()->styleHint(QStyle::SH_ScrollBar_Transient, &opt, q)) {
        flashed = true;
        if (!q->isVisible())
            q->show();
        else
            q->update();
    }
    if (!flashTimer.isActive())
        flashTimer.start(0ns, q);
}